

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

Float __thiscall
pbrt::DielectricBxDF::PDF
          (DielectricBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  Vector3<float> v;
  Vector3<float> v_00;
  Vector3<float> v2;
  Vector3<float> v2_00;
  Vector3<float> v_01;
  Vector3f wm_00;
  Vector3f wm_01;
  Vector3<float> v1;
  Vector3<float> v1_00;
  Normal3<float> n2;
  Vector3f w;
  Vector3f w_00;
  Vector3<float> v_02;
  Vector3<float> w_01;
  Vector3<float> v_03;
  Vector3<float> w_02;
  Vector3<float> v_04;
  Vector3<float> w_03;
  Vector3<float> v_05;
  Vector3<float> w_04;
  Vector3<float> v_06;
  Vector3<float> w_05;
  Vector3<float> v_07;
  Vector3f w_06;
  Vector3f w_07;
  bool bVar1;
  int iVar2;
  BxDFReflTransFlags in_EDX;
  float *in_RDI;
  long *in_FS_OFFSET;
  float fVar3;
  float fVar4;
  Float FVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  float in_XMM1_Da;
  undefined1 in_ZMM2 [64];
  float in_XMM3_Da;
  Vector3<float> VVar11;
  Float dwm_dwi;
  Float denom;
  Float pdf;
  Float pt;
  Float pr;
  Float T;
  Float R;
  Vector3f wm;
  float etap;
  bool reflect;
  Float cosTheta_i;
  Float cosTheta_o;
  float in_stack_fffffffffffffbb8;
  float in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 in_stack_fffffffffffffbc8;
  float in_stack_fffffffffffffbcc;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  float in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  float in_stack_fffffffffffffc04;
  undefined8 in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  float in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  float in_stack_fffffffffffffc28;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffc2c;
  undefined4 uVar13;
  float in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  float in_stack_fffffffffffffc48;
  float local_2a8;
  float local_2a4;
  float local_2a0;
  __0 local_f9;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  float local_98;
  byte local_91;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  Float local_74;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  float local_54;
  BxDFReflTransFlags local_50;
  undefined8 local_3c;
  undefined8 local_2c;
  float local_24;
  undefined8 local_20;
  undefined8 local_10;
  float local_8;
  undefined1 auVar6 [64];
  
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_3c = vmovlpd_avx(in_ZMM2._0_16_);
  FVar5 = SUB84(in_RDI,0);
  fVar4 = (float)((ulong)in_RDI >> 0x20);
  if (((*in_RDI != 1.0) || (NAN(*in_RDI))) &&
     (local_50 = in_EDX, local_2c = local_3c, local_24 = in_XMM3_Da, local_10 = local_20,
     local_8 = in_XMM1_Da,
     bVar1 = TrowbridgeReitzDistribution::EffectivelySmooth((TrowbridgeReitzDistribution *)0x6f01ce)
     , !bVar1)) {
    local_58 = local_8;
    local_60 = local_10;
    local_68 = local_8;
    local_70 = local_10;
    w_07.super_Tuple3<pbrt::Vector3,_float>.z = local_8;
    w_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_10;
    w_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_10._4_4_;
    local_54 = CosTheta(w_07);
    local_78 = local_24;
    local_80 = local_2c;
    local_88 = local_24;
    local_90 = local_2c;
    w_06.super_Tuple3<pbrt::Vector3,_float>.z = local_24;
    w_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c;
    w_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c._4_4_;
    local_74 = CosTheta(w_06);
    local_91 = 0.0 < local_74 * local_54;
    local_98 = 1.0;
    if (!(bool)local_91) {
      if (local_54 <= 0.0) {
        in_stack_fffffffffffffbcc = 1.0 / *(float *)CONCAT44(fVar4,FVar5);
        local_98 = in_stack_fffffffffffffbcc;
      }
      else {
        in_stack_fffffffffffffbcc = *(float *)CONCAT44(fVar4,FVar5);
        local_98 = in_stack_fffffffffffffbcc;
      }
    }
    auVar10 = (undefined1  [56])0x0;
    VVar11 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar4,FVar5),
                        in_stack_fffffffffffffbcc);
    local_c0 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar10;
    local_c8 = vmovlpd_avx(auVar6._0_16_);
    local_d0 = local_8;
    local_d8 = local_10;
    local_e0 = local_8;
    local_e8 = local_10;
    auVar10 = ZEXT856(0);
    VVar11.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffbe4;
    VVar11.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffbe0;
    VVar11.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffbe8;
    local_b8 = local_c8;
    local_b0 = local_c0;
    VVar11 = Tuple3<pbrt::Vector3,float>::operator+
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),VVar11);
    local_f0 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar10;
    local_f8 = vmovlpd_avx(auVar7._0_16_);
    local_a8 = local_f8;
    local_a0 = local_f0;
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar2 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                     ::reg), iVar2 != 0)) {
      PDF(pbrt::Vector3,pbrt::Vector3,pbrt::TransportMode,pbrt::BxDFReflTransFlags)_const::$_0::
      operator_cast_to_function_pointer(&local_f9);
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (AccumFunc)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    in_FS_OFFSET[-0x8c] = in_FS_OFFSET[-0x8c] + 1;
    v.super_Tuple3<pbrt::Vector3,_float>.y = FVar5;
    v.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffbcc;
    v.super_Tuple3<pbrt::Vector3,_float>.z = fVar4;
    fVar3 = LengthSquared<float>(v);
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      *(long *)(*in_FS_OFFSET + -0x468) = *(long *)(*in_FS_OFFSET + -0x468) + 1;
    }
    if (((local_74 != 0.0) || (NAN(local_74))) && ((local_54 != 0.0 || (NAN(local_54))))) {
      v_00.super_Tuple3<pbrt::Vector3,_float>.y = FVar5;
      v_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffbcc;
      v_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar4;
      fVar4 = LengthSquared<float>(v_00);
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        auVar10 = ZEXT856(0);
        v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc10;
        v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc08;
        v_01.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
        VVar11 = Normalize<float>(v_01);
        auVar8._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar8._8_56_ = auVar10;
        vmovlpd_avx(auVar8._0_16_);
        Normal3<float>::Normal3
                  ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,0.0);
        auVar10 = ZEXT856(0);
        v_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc44;
        v_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc40;
        v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc48;
        n2.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffc24;
        n2.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffffc20;
        n2.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffc28;
        VVar11 = FaceForward<float>(v_02,n2);
        local_a0 = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar9._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar9._8_56_ = auVar10;
        local_a8 = vmovlpd_avx(auVar9._0_16_);
        v_07.super_Tuple3<pbrt::Vector3,_float>.z = local_a0;
        v_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_a8;
        v_07.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_a8 >> 0x20);
        w_05.super_Tuple3<pbrt::Vector3,_float>.z = local_24;
        w_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c;
        w_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c._4_4_;
        fVar4 = Dot<float>(v_07,w_05);
        if ((fVar4 * local_74 < 0.0) ||
           (v_06.super_Tuple3<pbrt::Vector3,_float>.z = local_a0,
           v_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8,
           v_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_,
           w_04.super_Tuple3<pbrt::Vector3,_float>.z = local_8,
           w_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_10,
           w_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_10._4_4_,
           fVar4 = Dot<float>(v_06,w_04), fVar4 * local_54 < 0.0)) {
          return 0.0;
        }
        v_05.super_Tuple3<pbrt::Vector3,_float>.z = local_8;
        v_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_10;
        v_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_10._4_4_;
        w_03.super_Tuple3<pbrt::Vector3,_float>.z = local_a0;
        w_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
        w_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
        Dot<float>(v_05,w_03);
        local_2a0 = FrDielectric(FVar5,in_stack_fffffffffffffbcc);
        local_2a4 = 1.0 - local_2a0;
        iVar2 = operator&(local_50,Reflection);
        if (iVar2 == 0) {
          local_2a0 = 0.0;
        }
        iVar2 = operator&(local_50,Transmission);
        if (iVar2 == 0) {
          local_2a4 = 0.0;
        }
        if ((((local_2a0 == 0.0) && (!NAN(local_2a0))) && (local_2a4 == 0.0)) && (!NAN(local_2a4)))
        {
          return 0.0;
        }
        if ((local_91 & 1) == 0) {
          v_04.super_Tuple3<pbrt::Vector3,_float>.z = local_24;
          v_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c;
          v_04.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c._4_4_;
          w_02.super_Tuple3<pbrt::Vector3,_float>.z = local_a0;
          w_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
          w_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
          fVar4 = Dot<float>(v_04,w_02);
          v_03.super_Tuple3<pbrt::Vector3,_float>.z = local_8;
          v_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_10;
          v_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_10._4_4_;
          w_01.super_Tuple3<pbrt::Vector3,_float>.z = local_a0;
          w_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
          w_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
          fVar3 = Dot<float>(v_03,w_01);
          fVar4 = Sqr<float>(fVar4 + fVar3 / local_98);
          uVar12 = (undefined4)local_2c;
          uVar13 = (undefined4)((ulong)local_2c >> 0x20);
          v1_00.super_Tuple3<pbrt::Vector3,_float>.z = local_a0;
          v1_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
          v1_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
          v2_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc00;
          v2_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffbfc;
          v2_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc04;
          fVar3 = AbsDot<float>(v1_00,v2_00);
          w_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar13;
          w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar12;
          w_00.super_Tuple3<pbrt::Vector3,_float>.z = local_24;
          wm_01.super_Tuple3<pbrt::Vector3,_float>.z = local_8;
          wm_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_10;
          wm_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_10._4_4_;
          FVar5 = TrowbridgeReitzDistribution::PDF
                            ((TrowbridgeReitzDistribution *)
                             CONCAT44(in_stack_fffffffffffffbf4,local_8),w_00,wm_01);
          local_2a8 = (FVar5 * (fVar3 / fVar4) * local_2a4) / (local_2a0 + local_2a4);
        }
        else {
          w.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc2c;
          w.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffc28;
          w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc30;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc10;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc08;
          wm_00.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
          FVar5 = TrowbridgeReitzDistribution::PDF
                            ((TrowbridgeReitzDistribution *)
                             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),w,wm_00);
          v1.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc20;
          v1.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffc18;
          v1.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffffc18 >> 0x20);
          v2.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc00;
          v2.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffbfc;
          v2.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc04;
          fVar4 = AbsDot<float>(v1,v2);
          local_2a8 = ((FVar5 / (fVar4 * 4.0)) * local_2a0) / (local_2a0 + local_2a4);
        }
        return local_2a8;
      }
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU Float DielectricBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                          BxDFReflTransFlags sampleFlags) const {
    if (eta == 1 || mfDistrib.EffectivelySmooth())
        return 0;
    // Evaluate sampling PDF of rough dielectric BSDF
    // Compute generalized half vector _wm_
    Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
    bool reflect = cosTheta_i * cosTheta_o > 0;
    float etap = 1;
    if (!reflect)
        etap = cosTheta_o > 0 ? eta : (1 / eta);
    Vector3f wm = wi * etap + wo;
    CHECK_RARE(1e-5f, LengthSquared(wm) == 0);
    if (cosTheta_i == 0 || cosTheta_o == 0 || LengthSquared(wm) == 0)
        return {};
    wm = FaceForward(Normalize(wm), Normal3f(0, 0, 1));

    // Discard backfacing microfacets
    if (Dot(wm, wi) * cosTheta_i < 0 || Dot(wm, wo) * cosTheta_o < 0)
        return {};

    // Determine Fresnel reflectance of rough dielectric boundary
    Float R = FrDielectric(Dot(wo, wm), eta);
    Float T = 1 - R;

    // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
    Float pr = R, pt = T;
    if (!(sampleFlags & BxDFReflTransFlags::Reflection))
        pr = 0;
    if (!(sampleFlags & BxDFReflTransFlags::Transmission))
        pt = 0;
    if (pr == 0 && pt == 0)
        return {};

    // Return PDF for rough dielectric
    Float pdf;
    if (reflect) {
        // Compute PDF of rough dielectric reflection
        pdf = mfDistrib.PDF(wo, wm) / (4 * AbsDot(wo, wm)) * pr / (pr + pt);

    } else {
        // Compute PDF of rough dielectric transmission
        Float denom = Sqr(Dot(wi, wm) + Dot(wo, wm) / etap);
        Float dwm_dwi = AbsDot(wi, wm) / denom;
        pdf = mfDistrib.PDF(wo, wm) * dwm_dwi * pt / (pr + pt);
    }
    return pdf;
}